

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FlowGraph.cpp
# Opt level: O0

bool __thiscall Loop::IsSymAssignedToInSelfOrParents(Loop *this,StackSym *sym)

{
  bool bVar1;
  StackSym *sym_local;
  Loop *this_local;
  
  bVar1 = IsSymAssignedToInSelfOrParents(this,(sym->super_Sym).m_id);
  return bVar1;
}

Assistant:

bool
Loop::IsSymAssignedToInSelfOrParents(StackSym * const sym) const
{
    return IsSymAssignedToInSelfOrParents(sym->m_id);
}